

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotLikeOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  ulong uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  string_t pattern;
  string_t pattern_00;
  string_t pattern_01;
  string_t str;
  string_t str_00;
  string_t str_01;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t i;
  idx_t iVar10;
  undefined8 in_stack_ffffffffffffff98;
  bool *pbVar11;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      str_01.value.pointer.ptr = (char *)in_stack_ffffffffffffffb0;
      str_01.value._0_8_ = in_stack_ffffffffffffffa8;
      pattern_01.value.pointer.ptr = result_data;
      pattern_01.value._0_8_ = in_stack_ffffffffffffff98;
      bVar4 = NotLikeOperator::Operation<duckdb::string_t,duckdb::string_t,bool>(str_01,pattern_01);
      result_data[iVar10] = bVar4;
    }
  }
  else {
    uVar1 = count + 0x3f;
    uVar8 = 0;
    iVar10 = count;
    for (uVar6 = 0; uVar6 != uVar1 >> 6; uVar6 = uVar6 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar7 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar7 = count;
        }
LAB_015460d0:
        for (; uVar5 = uVar8, pbVar11 = result_data, uVar8 < uVar7; uVar8 = uVar8 + 1) {
          str.value.pointer.ptr = (char *)iVar10;
          str.value._0_8_ = rdata;
          pattern.value.pointer.ptr = result_data;
          pattern.value._0_8_ = uVar6;
          bVar4 = NotLikeOperator::Operation<duckdb::string_t,duckdb::string_t,bool>(str,pattern);
          result_data[uVar8] = bVar4;
        }
      }
      else {
        uVar3 = puVar2[uVar6];
        uVar7 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar7 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_015460d0;
        uVar5 = uVar7;
        pbVar11 = result_data;
        if (uVar3 != 0) {
          count = iVar10;
          for (uVar9 = 0; uVar5 = uVar8 + uVar9, iVar10 = count, uVar8 + uVar9 < uVar7;
              uVar9 = uVar9 + 1) {
            if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
              str_00.value.pointer.ptr = (char *)count;
              str_00.value._0_8_ = rdata;
              pattern_00.value.pointer.ptr = pbVar11;
              pattern_00.value._0_8_ = uVar6;
              bVar4 = NotLikeOperator::Operation<duckdb::string_t,duckdb::string_t,bool>
                                (str_00,pattern_00);
              result_data[uVar9 + uVar8] = bVar4;
            }
          }
        }
      }
      uVar8 = uVar5;
      result_data = pbVar11;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}